

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c-writer.cc
# Opt level: O2

void __thiscall wabt::anon_unknown_0::CWriter::WriteTailCallExports(CWriter *this,CWriterPhase kind)

{
  pointer ppEVar1;
  Export *pEVar2;
  bool bVar3;
  Func *name;
  Newline *args;
  char (*u) [5];
  Newline *u_00;
  pointer ppEVar4;
  string *mangled_name_00;
  string_view export_name;
  string_view str;
  string mangled_name;
  string local_50;
  
  ppEVar1 = (this->module_->exports).
            super__Vector_base<wabt::Export_*,_std::allocator<wabt::Export_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppEVar4 = (this->module_->exports).
                 super__Vector_base<wabt::Export_*,_std::allocator<wabt::Export_*>_>._M_impl.
                 super__Vector_impl_data._M_start; ppEVar4 != ppEVar1; ppEVar4 = ppEVar4 + 1) {
    pEVar2 = *ppEVar4;
    if (pEVar2->kind == First) {
      name = Module::GetFunc(this->module_,&pEVar2->var);
      bVar3 = IsImport(this,&name->name);
      if ((bVar3) || ((name->features_used).tailcall == true)) {
        args = (Newline *)(pEVar2->name)._M_dataplus._M_p;
        export_name._M_str = (char *)args;
        export_name._M_len = (pEVar2->name)._M_string_length;
        (anonymous_namespace)::CWriter::ExportName_abi_cxx11_(&local_50,(CWriter *)this,export_name)
        ;
        std::operator+(&mangled_name,"wasm_tailcall_",&local_50);
        std::__cxx11::string::_M_dispose();
        str._M_str = (char *)args;
        str._M_len = (size_t)(pEVar2->name)._M_dataplus._M_p;
        (anonymous_namespace)::SanitizeForComment_abi_cxx11_
                  (&local_50,(_anonymous_namespace_ *)(pEVar2->name)._M_string_length,str);
        Write(this);
        WriteData(this,"/* export for tail-call of \'",0x1c);
        (anonymous_namespace)::CWriter::
        Write<std::__cxx11::string,char_const(&)[5],wabt::(anonymous_namespace)::Newline>
                  ((CWriter *)this,&local_50,u,args);
        std::__cxx11::string::_M_dispose();
        mangled_name_00 = &mangled_name;
        WriteTailCallFuncDeclaration(this,mangled_name_00);
        if (kind == Declarations) {
          (anonymous_namespace)::CWriter::
          Write<char_const(&)[2],wabt::(anonymous_namespace)::Newline>
                    ((CWriter *)this,(char (*) [2])0x1e5996,u_00);
        }
        else {
          (anonymous_namespace)::CWriter::
          Write<char_const(&)[2],wabt::(anonymous_namespace)::OpenBrace>
                    ((CWriter *)this,(char (*) [2])mangled_name_00,(OpenBrace *)u_00);
          local_50._M_string_length = (size_type)Module::GetFunc(this->module_,&pEVar2->var);
          local_50._M_dataplus._M_p._0_4_ = 0;
          Write(this,(TailCallRef *)&local_50);
          WriteData(this,"(instance_ptr, tail_call_stack, next);",0x26);
          Write(this);
          Write(this);
          Write(this);
        }
        std::__cxx11::string::_M_dispose();
      }
    }
  }
  return;
}

Assistant:

void CWriter::WriteTailCallExports(CWriterPhase kind) {
  for (const Export* export_ : module_->exports) {
    if (export_->kind != ExternalKind::Func) {
      continue;
    }

    const Func* func = module_->GetFunc(export_->var);

    if (!IsImport(func->name) && !func->features_used.tailcall) {
      continue;
    }

    const std::string mangled_name = TailCallExportName(export_->name);

    Write(Newline(), "/* export for tail-call of '",
          SanitizeForComment(export_->name), "' */", Newline());
    if (kind == CWriterPhase::Declarations) {
      WriteTailCallFuncDeclaration(mangled_name);
      Write(";", Newline());
    } else {
      WriteTailCallFuncDeclaration(mangled_name);
      Write(" ", OpenBrace());
      const Func* func = module_->GetFunc(export_->var);
      Write(TailCallRef(func->name), "(instance_ptr, tail_call_stack, next);",
            Newline(), CloseBrace(), Newline());
    }
  }
}